

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O1

void check_string(string *s)

{
  byte bVar1;
  byte *ptr;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte *pbVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  runtime_error *this;
  byte *pbVar11;
  ulong uVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  uint uVar16;
  byte *pbVar17;
  int iVar18;
  byte *pbVar19;
  byte *pbVar20;
  ulong uVar21;
  bool bVar22;
  double dVar23;
  double local_40;
  double local_38;
  
  ptr = (byte *)(s->_M_dataplus)._M_p;
  bVar1 = *ptr;
  pbVar11 = ptr;
  if (bVar1 == 0x2d) {
    if ((byte)(ptr[1] - 0x30) < 10) {
      pbVar11 = ptr + 1;
      goto LAB_00102be4;
    }
LAB_00102d83:
    pbVar7 = (byte *)0x0;
    goto LAB_00102d85;
  }
LAB_00102be4:
  if (*pbVar11 == 0x30) {
    uVar21 = 0;
    pbVar7 = (byte *)0x0;
    if ((byte)(pbVar11[1] - 0x30) < 10) goto LAB_00102d85;
    pbVar19 = pbVar11 + 1;
  }
  else {
    bVar13 = *pbVar11 - 0x30;
    if (9 < bVar13) goto LAB_00102d83;
    uVar21 = (ulong)bVar13;
    bVar13 = pbVar11[1];
    pbVar7 = pbVar11;
    while( true ) {
      pbVar19 = pbVar7 + 1;
      if (9 < (byte)(bVar13 - 0x30)) break;
      uVar21 = (ulong)(byte)(bVar13 - 0x30) + uVar21 * 10;
      bVar13 = pbVar7[2];
      pbVar7 = pbVar19;
    }
  }
  if (*pbVar19 == 0x2e) {
    if (9 < (byte)(pbVar19[1] - 0x30)) goto LAB_00102d83;
    uVar21 = (ulong)(byte)(pbVar19[1] - 0x30) + uVar21 * 10;
    pbVar7 = pbVar19 + 2;
    bVar13 = pbVar19[2];
    while ((byte)(bVar13 - 0x30) < 10) {
      uVar21 = (ulong)(byte)(bVar13 - 0x30) + uVar21 * 10;
      pbVar17 = pbVar7 + 1;
      pbVar7 = pbVar7 + 1;
      bVar13 = *pbVar17;
    }
    pbVar17 = pbVar19 + (1 - (long)pbVar7);
    pbVar19 = pbVar7;
  }
  else {
    pbVar17 = (byte *)0x0;
  }
  pbVar7 = pbVar19;
  if ((*pbVar19 | 0x20) == 0x65) {
    bVar22 = (pbVar19[1] - 0x2b & 0xfd) == 0;
    pbVar7 = pbVar19 + 1;
    if (bVar22) {
      pbVar7 = pbVar19 + 2;
    }
    bVar13 = pbVar19[(ulong)bVar22 + 1] - 0x30;
    if (bVar13 < 10) {
      bVar14 = pbVar7[1] - 0x30;
      uVar8 = (ulong)bVar14 + (ulong)bVar13 * 10;
      if (9 < bVar14) {
        uVar8 = (ulong)bVar13;
      }
      pbVar20 = pbVar7 + 2;
      if (9 < bVar14) {
        pbVar20 = pbVar7 + 1;
      }
      bVar14 = pbVar7[(ulong)(bVar14 < 10) + 1] - 0x30;
      pbVar7 = pbVar20 + (bVar14 < 10);
      uVar15 = (ulong)bVar14 + uVar8 * 10;
      if (9 < bVar14) {
        uVar15 = uVar8;
      }
      bVar14 = *pbVar7;
      while ((byte)(bVar14 - 0x30) < 10) {
        if ((long)uVar15 < 0x100000000) {
          uVar15 = (ulong)(byte)(bVar14 - 0x30) + uVar15 * 10;
        }
        pbVar20 = pbVar7 + 1;
        pbVar7 = pbVar7 + 1;
        bVar14 = *pbVar20;
      }
      uVar8 = -uVar15;
      if (pbVar19[1] != 0x2d) {
        uVar8 = uVar15;
      }
      pbVar17 = pbVar17 + uVar8;
    }
    if (9 < bVar13) goto LAB_00102d83;
  }
  iVar18 = (int)pbVar19 + ~(uint)pbVar11;
  if (0x12 < iVar18) {
    for (lVar9 = 0; (pbVar11[lVar9] == 0x30 || (pbVar11[lVar9] == 0x2e)); lVar9 = lVar9 + 1) {
    }
    if (0x12 < iVar18 - (int)lVar9) {
      pbVar7 = (byte *)fast_double_parser::parse_float_strtod((char *)ptr,&local_40);
      goto LAB_00102d85;
    }
  }
  if ((byte *)0xfffffffffffffd85 < pbVar17 + -0x135) {
    if ((uVar21 >> 0x35 == 0) && (pbVar17 + 0x16 < (byte *)0x2d)) {
      if ((long)pbVar17 < 0) {
        local_40 = (double)(long)uVar21 /
                   *(double *)
                    (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                     power_of_ten + (long)pbVar17 * -8);
      }
      else {
        local_40 = (double)(long)uVar21 *
                   *(double *)
                    (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                     power_of_ten + (long)pbVar17 * 8);
      }
      if (bVar1 == 0x2d) {
        local_40 = -local_40;
      }
      goto LAB_00102d85;
    }
    if (uVar21 == 0) {
      if (bVar1 == 0x2d) {
        local_40 = -0.0;
      }
      else {
        local_40 = 0.0;
      }
      goto LAB_00102d85;
    }
    uVar8 = 0x3f;
    if (uVar21 != 0) {
      for (; uVar21 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar21 = uVar21 << ((byte)(uVar8 ^ 0x3f) & 0x3f);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar21;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                              mantissa_64 + (long)pbVar17 * 8 + 0xa28);
    auVar2 = auVar2 * auVar4;
    if ((((~auVar2._8_4_ & 0x1ff) != 0) || (!CARRY8(auVar2._0_8_,uVar21))) ||
       (auVar3._8_8_ = 0, auVar3._0_8_ = uVar21, auVar5._8_8_ = 0,
       auVar5._0_8_ = *(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)
                                 ::mantissa_128 + (long)pbVar17 * 8 + 0xa28), auVar6._8_8_ = 0,
       auVar6._0_8_ = SUB168(auVar3 * auVar5,8), auVar2 = auVar2 + auVar6,
       uVar21 <= ~SUB168(auVar3 * auVar5,0) || ((~auVar2._8_4_ & 0x1ff) != 0 || auVar2._0_8_ != -1))
       ) {
      uVar21 = auVar2._8_8_ >> (9U - (auVar2[0xf] >> 7) & 0x3f);
      uVar16 = (uint)uVar21;
      if (((auVar2 & (undefined1  [16])0x1ff) != (undefined1  [16])0x0 || auVar2._0_8_ != 0) ||
         ((uVar16 & 3) != 1)) {
        uVar21 = (uVar16 & 1) + uVar21;
        uVar15 = uVar21 >> 0x36;
        uVar8 = (((long)pbVar17 * 0x3526a >> 0x10) + 0x43f) -
                ((auVar2._8_8_ >> 0x3f ^ 1) + (uVar8 ^ 0x3f) + -1 + (ulong)(uVar15 == 0));
        if ((uVar8 != 0) && (uVar8 < 0x7ff)) {
          uVar12 = 0;
          if (uVar15 == 0) {
            uVar12 = uVar21 >> 1 & 0xefffffffffffff;
          }
          local_40 = (double)((ulong)(bVar1 == 0x2d) << 0x3f | uVar12 | uVar8 << 0x34);
          goto LAB_00102d85;
        }
      }
    }
    local_40 = 0.0;
  }
  pbVar7 = (byte *)fast_double_parser::parse_float_strtod((char *)ptr,&local_40);
LAB_00102d85:
  if (pbVar7 == (byte *)0x0) {
    printf("fast_double_parser refused to parse %s\n",(s->_M_dataplus)._M_p);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"fast_double_parser refused to parse");
  }
  else {
    if (check_string(std::__cxx11::string)::c_locale == '\0') {
      check_string();
    }
    dVar23 = strtod_l((s->_M_dataplus)._M_p,(char **)0x0,(__locale_t)check_string::c_locale);
    if ((dVar23 == local_40) && (!NAN(dVar23) && !NAN(local_40))) {
      return;
    }
    local_38 = local_40;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"fast_double_parser disagrees",0x1c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    printf("fast_double_parser: %.*e\n",local_38,0x10);
    printf("reference: %.*e\n",dVar23,0x10);
    printf("string: %s\n",(s->_M_dataplus)._M_p);
    if ((long)((ulong)local_38 ^ (ulong)dVar23) < 0) {
      lVar9 = (long)dVar23 + (long)local_38 + 0x80000000;
    }
    else {
      lVar10 = (long)local_38 - (long)dVar23;
      lVar9 = -lVar10;
      if (0 < lVar10) {
        lVar9 = lVar10;
      }
    }
    printf("f64_ulp_dist = %d\n",lVar9);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"fast_double_parser disagrees");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_string(std::string s) {
  double x;
  bool isok = fast_double_parser::parse_number(s.data(), &x);
  if (!isok) {
    printf("fast_double_parser refused to parse %s\n", s.c_str());
    throw std::runtime_error("fast_double_parser refused to parse");
  }
#if defined(FAST_DOUBLE_PARSER_SOLARIS) || defined(FAST_DOUBLE_PARSER_CYGWIN) 
  // workround for cygwin, solaris
  char *endptr;
  double d = cygwin_strtod_l(s.data(), &endptr);
#elif defined(_WIN32)
  static _locale_t c_locale = _create_locale(LC_ALL, "C");
  double d = _strtod_l(s.data(), nullptr, c_locale);
#else
  static locale_t c_locale = newlocale(LC_ALL_MASK, "C", NULL);
  double d = strtod_l(s.data(), nullptr, c_locale);
#endif
  if (d != x) {
    std::cerr << "fast_double_parser disagrees" << std::endl;
    printf("fast_double_parser: %.*e\n", DBL_DIG + 1, x);
    printf("reference: %.*e\n", DBL_DIG + 1, d);
    printf("string: %s\n", s.c_str());
    printf("f64_ulp_dist = %d\n", (int)f64_ulp_dist(x, d));
    throw std::runtime_error("fast_double_parser disagrees");
  }
}